

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O3

Graph * __thiscall Graph::returnCopy(Graph *this)

{
  int iVar1;
  double dVar2;
  double dVar3;
  Graph *this_00;
  int idLoadFactor;
  int idLoadFactor_00;
  Vertex *pVVar4;
  Vertex *this_01;
  Edge *pEVar5;
  
  this_00 = (Graph *)operator_new(0x88);
  (this_00->capacitorType).super__Vector_base<Capacitor,_std::allocator<Capacitor>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->capacitorType).super__Vector_base<Capacitor,_std::allocator<Capacitor>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->capacitorType).super__Vector_base<Capacitor,_std::allocator<Capacitor>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00->mw_factor = 0.001;
  this_00->verticesList = (Vertex *)0x0;
  this_00->verticesSize = 0;
  this_00->edgesSize = 0;
  this_00->totalActiveLoss = 0.0;
  this_00->totalReactiveLoss = 0.0;
  this_00->maxCapacitorsBus = 0;
  (this_00->loads).super__Vector_base<LoadLevel,_std::allocator<LoadLevel>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->loads).super__Vector_base<LoadLevel,_std::allocator<LoadLevel>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->loads).super__Vector_base<LoadLevel,_std::allocator<LoadLevel>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00->idFac = 0;
  this_00->numberOfMarked = 0;
  pVVar4 = this->verticesList;
  this_01 = pVVar4->nextVertex;
  if (this_01 != (Vertex *)0x0) {
    do {
      iVar1 = this_01->id;
      dVar2 = Vertex::getActivePower(this_01);
      dVar3 = Vertex::getReactivePower(this_01);
      insertVertex(this_00,iVar1,dVar2,dVar3,this_01->voltage,idLoadFactor);
      this_01 = this_01->nextVertex;
    } while (this_01 != (Vertex *)0x0);
    pVVar4 = this->verticesList;
  }
  iVar1 = pVVar4->id;
  dVar2 = Vertex::getActivePower(pVVar4);
  dVar3 = Vertex::getReactivePower(pVVar4);
  insertVertex(this_00,iVar1,dVar2,dVar3,pVVar4->voltage,idLoadFactor_00);
  for (pVVar4 = this->verticesList; pVVar4 != (Vertex *)0x0; pVVar4 = pVVar4->nextVertex) {
    for (pEVar5 = pVVar4->edgesList; pEVar5 != (Edge *)0x0; pEVar5 = pEVar5->nextEdge) {
      insertEdge(this_00,pEVar5->origin->id,pEVar5->destiny->id,pEVar5->id,pEVar5->resistance,
                 pEVar5->reactance,pEVar5->closed);
    }
  }
  return this_00;
}

Assistant:

Graph *Graph::returnCopy(){
    Graph *g = new Graph();
    int originId, destinyId, edgeId, vertexId;
    double resist, react, activePower, reactivePower, voltage;

    for(Vertex *no= this->verticesList->getNext(); no!=NULL; no= no->getNext()){
        vertexId = no->getID();
        activePower = no->getActivePower();
        reactivePower = no->getReactivePower();
        voltage = no->getVoltage();

        g->insertVertex(vertexId, activePower, reactivePower, voltage);
    }

    //inserindo no fonte por ultimo pos a funcao que insere nós insere sempre no inicio da lista, assim o nó fonte fica no inicio da lista
    Vertex *source = this->verticesList;
    g->insertVertex(source->getID(), source->getActivePower(), source->getReactivePower(), source->getVoltage());

    for(Vertex *v=this->verticesList; v!=NULL; v= v->getNext()){
         for(Edge *e= v->getEdgesList(); e!=NULL; e= e->getNext()){
            originId = e->getOrigin()->getID();
            destinyId = e->getDestiny()->getID();
            edgeId = e->getID();
            resist = e->getResistance();
            react = e->getReactance();

             g->insertEdge(originId, destinyId, edgeId, resist, react, e->isClosed());
        }
    }
    return g;
}